

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::ColoredPrintf(GTestColor color,char *fmt,...)

{
  int iVar1;
  char *pcVar2;
  char *in_RSI;
  GTestColor in_EDI;
  bool use_color;
  va_list args;
  bool local_f2;
  undefined4 local_28;
  undefined4 local_24;
  undefined1 stdout_is_tty;
  
  stdout_is_tty = (undefined1)((ulong)&stack0x00000008 >> 0x30);
  local_24 = 0x30;
  local_28 = 0x10;
  if ((ColoredPrintf(testing::internal::(anonymous_namespace)::GTestColor,char_const*,...)::
       in_color_mode == '\0') &&
     (iVar1 = __cxa_guard_acquire(&ColoredPrintf(testing::internal::(anonymous_namespace)::GTestColor,char_const*,...)
                                   ::in_color_mode), iVar1 != 0)) {
    iVar1 = posix::FileNo((FILE *)0x1464a5);
    posix::IsATTY(iVar1);
    ColoredPrintf::in_color_mode = ShouldUseColor((bool)stdout_is_tty);
    __cxa_guard_release(&ColoredPrintf(testing::internal::(anonymous_namespace)::GTestColor,char_const*,...)
                         ::in_color_mode);
  }
  local_f2 = (ColoredPrintf::in_color_mode & 1U) == 0 || in_EDI == kDefault;
  if (local_f2) {
    vprintf(in_RSI,&local_28);
  }
  else {
    pcVar2 = GetAnsiColorCode(in_EDI);
    printf("\x1b[0;3%sm",pcVar2);
    vprintf(in_RSI,&local_28);
    printf("\x1b[m");
  }
  return;
}

Assistant:

static void ColoredPrintf(GTestColor color, const char* fmt, ...) {
  va_list args;
  va_start(args, fmt);

  static const bool in_color_mode =
      // We don't condition this on GTEST_HAS_FILE_SYSTEM because we still need
      // to be able to detect terminal I/O regardless.
      ShouldUseColor(posix::IsATTY(posix::FileNo(stdout)) != 0);

  const bool use_color = in_color_mode && (color != GTestColor::kDefault);

  if (!use_color) {
    vprintf(fmt, args);
    va_end(args);
    return;
  }

#if defined(GTEST_OS_WINDOWS) && !defined(GTEST_OS_WINDOWS_MOBILE) &&       \
    !defined(GTEST_OS_WINDOWS_GAMES) && !defined(GTEST_OS_WINDOWS_PHONE) && \
    !defined(GTEST_OS_WINDOWS_RT) && !defined(GTEST_OS_WINDOWS_MINGW)
  const HANDLE stdout_handle = GetStdHandle(STD_OUTPUT_HANDLE);

  // Gets the current text color.
  CONSOLE_SCREEN_BUFFER_INFO buffer_info;
  GetConsoleScreenBufferInfo(stdout_handle, &buffer_info);
  const WORD old_color_attrs = buffer_info.wAttributes;
  const WORD new_color = GetNewColor(color, old_color_attrs);

  // We need to flush the stream buffers into the console before each
  // SetConsoleTextAttribute call lest it affect the text that is already
  // printed but has not yet reached the console.
  fflush(stdout);
  SetConsoleTextAttribute(stdout_handle, new_color);

  vprintf(fmt, args);

  fflush(stdout);
  // Restores the text color.
  SetConsoleTextAttribute(stdout_handle, old_color_attrs);
#else
  printf("\033[0;3%sm", GetAnsiColorCode(color));
  vprintf(fmt, args);
  printf("\033[m");  // Resets the terminal to default.
#endif  // GTEST_OS_WINDOWS && !GTEST_OS_WINDOWS_MOBILE
  va_end(args);
}